

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void simple_motion_search_prune_rect
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_state)

{
  float fVar1;
  BLOCK_SIZE bsize_00;
  float *pfVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  AV1_COMMON *cm_00;
  float *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int num_classes;
  float probs [10];
  float scores [10];
  int f_idx;
  float features [25];
  float prune_thresh;
  int agg;
  float *ml_std;
  float *ml_mean;
  NN_CONFIG *nn_config;
  int res_idx;
  int is_480p_or_larger;
  int is_720p_or_larger;
  int bsize_idx;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams *blk_params;
  AV1_COMMON *cm;
  int *in_stack_000029f0;
  int *in_stack_000029f8;
  float *in_stack_00002a00;
  AV1_COMP *in_stack_00002a08;
  int local_144;
  int local_140;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  float local_108 [11];
  int local_dc;
  float local_d8 [17];
  BLOCK_SIZE in_stack_ffffffffffffff6f;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  SIMPLE_MOTION_DATA_TREE *in_stack_ffffffffffffff78;
  MACROBLOCK *in_stack_ffffffffffffff80;
  AV1_COMP *in_stack_ffffffffffffff88;
  float *features_00;
  NN_CONFIG *pNVar6;
  BLOCK_SIZE bsize_01;
  undefined1 is_test_mode;
  
  is_test_mode = (undefined1)((ulong)in_RDX >> 0x38);
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  bsize_01 = (BLOCK_SIZE)((ulong)(in_RCX + 2) >> 0x38);
  bsize_00 = *(BLOCK_SIZE *)(in_RCX + 0xc);
  iVar4 = convert_bsize_to_idx(bsize_00);
  if (cm_00->width < cm_00->height) {
    local_140 = cm_00->width;
  }
  else {
    local_140 = cm_00->height;
  }
  if (cm_00->width < cm_00->height) {
    local_144 = cm_00->width;
  }
  else {
    local_144 = cm_00->height;
  }
  pNVar6 = av1_simple_motion_search_prune_rect_nn_config[iVar4];
  features_00 = av1_simple_motion_search_prune_rect_mean[iVar4];
  pfVar2 = av1_simple_motion_search_prune_rect_std[iVar4];
  iVar5 = get_simple_motion_search_prune_agg(*(int *)(in_RSI + 0x4208),*(int *)(in_RDI + 0x60990),1)
  ;
  if (((-1 < iVar5) &&
      (fVar1 = av1_simple_motion_search_prune_rect_thresh[iVar5]
               [(int)((uint)(0x1df < local_144) + (uint)(0x2cf < local_140))][iVar4],
      pNVar6 != (NN_CONFIG *)0x0)) && ((fVar1 != 0.0 || (NAN(fVar1))))) {
    memset(local_d8,0,100);
    simple_motion_search_prune_part_features
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,
               features_00,(int)pNVar6);
    if ((((*(int *)(in_RDI + 0x60994) != 0) && (iVar4 = frame_is_intra_only(cm_00), iVar4 == 0)) &&
        ((in_RCX[0x48] != 0.0 || (in_RCX[0x49] != 0.0)))) &&
       ((BLOCK_8X4 < bsize_00 && (iVar4 = av1_superres_scaled(cm_00), iVar4 == 0)))) {
      write_features_to_file
                (in_RSI,(_Bool)is_test_mode,in_RCX,(int)((ulong)cm_00 >> 0x20),(int)cm_00,bsize_01,
                 unaff_retaddr,in_stack_00000008);
      _Var3 = ext_ml_model_decision_before_none_part2
                        (in_stack_00002a08,in_stack_00002a00,in_stack_000029f8,in_stack_000029f0);
      if (_Var3) {
        return;
      }
    }
    for (local_dc = 0; local_dc < 0x19; local_dc = local_dc + 1) {
      local_d8[local_dc] = (local_d8[local_dc] - features_00[local_dc]) / pfVar2[local_dc];
    }
    memset(local_108,0,0x28);
    memset(&stack0xfffffffffffffec8,0,0x28);
    iVar4 = 10;
    if (bsize_00 == BLOCK_128X128 || bsize_00 == BLOCK_8X8) {
      iVar4 = 4;
    }
    (*av1_nn_predict)(local_d8,pNVar6,1,local_108);
    av1_nn_softmax((float *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (float *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),iVar4);
    if (in_stack_fffffffffffffecc <= fVar1) {
      in_RCX[0x4c] = 1.4013e-45;
    }
    if (in_stack_fffffffffffffed0 <= fVar1) {
      in_RCX[0x4d] = 1.4013e-45;
    }
  }
  return;
}

Assistant:

static void simple_motion_search_prune_rect(AV1_COMP *const cpi, MACROBLOCK *x,
                                            SIMPLE_MOTION_DATA_TREE *sms_tree,
                                            PartitionSearchState *part_state) {
  const AV1_COMMON *const cm = &cpi->common;
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  const int bsize_idx = convert_bsize_to_idx(bsize);
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  // res_idx is 0 for lowres, 1 for 48p, 2 for 720p+
  const int res_idx = is_480p_or_larger + is_720p_or_larger;

  // Get model parameters
  const NN_CONFIG *nn_config =
      av1_simple_motion_search_prune_rect_nn_config[bsize_idx];
  const float *ml_mean = av1_simple_motion_search_prune_rect_mean[bsize_idx],
              *ml_std = av1_simple_motion_search_prune_rect_std[bsize_idx];

  const int agg = get_simple_motion_search_prune_agg(
      x->qindex, cpi->sf.part_sf.simple_motion_search_prune_agg, 1);
  if (agg < 0) {
    return;
  }

  const float prune_thresh =
      av1_simple_motion_search_prune_rect_thresh[agg][res_idx][bsize_idx];

  // If there is no valid threshold, return immediately.
  if (!nn_config || prune_thresh == 0.0f) {
    return;
  }

  // Get features
  float features[FEATURE_SIZE_SMS_PRUNE_PART] = { 0.0f };
  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, features,
                                           FEATURE_SMS_PRUNE_PART_FLAG);

  // Note: it is intended to not normalize the features here, to keep it
  // consistent for all features collected and passed to the external model.
  if (cpi->sf.part_sf.simple_motion_search_prune_rect &&
      !frame_is_intra_only(cm) &&
      (part_state->partition_rect_allowed[HORZ] ||
       part_state->partition_rect_allowed[VERT]) &&
      bsize >= BLOCK_8X8 && !av1_superres_scaled(cm)) {
    // Write features to file
    write_features_to_file(
        cpi->oxcf.partition_info_path, cpi->ext_part_controller.test_mode,
        features, FEATURE_SIZE_SMS_PRUNE_PART, 1, bsize, mi_row, mi_col);

    if (ext_ml_model_decision_before_none_part2(
            cpi, features, &part_state->prune_rect_part[HORZ],
            &part_state->prune_rect_part[VERT])) {
      return;
    }
  }

  for (int f_idx = 0; f_idx < FEATURE_SIZE_SMS_PRUNE_PART; f_idx++) {
    features[f_idx] = (features[f_idx] - ml_mean[f_idx]) / ml_std[f_idx];
  }

  // Get probabilities
  float scores[EXT_PARTITION_TYPES] = { 0.0f },
        probs[EXT_PARTITION_TYPES] = { 0.0f };
  const int num_classes = (bsize == BLOCK_128X128 || bsize == BLOCK_8X8)
                              ? PARTITION_TYPES
                              : EXT_PARTITION_TYPES;

  av1_nn_predict(features, nn_config, 1, scores);

  av1_nn_softmax(scores, probs, num_classes);

  // Determine if we should prune rectangular partitions.
  if (probs[PARTITION_HORZ] <= prune_thresh) {
    part_state->prune_rect_part[HORZ] = 1;
  }
  if (probs[PARTITION_VERT] <= prune_thresh) {
    part_state->prune_rect_part[VERT] = 1;
  }
}